

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerSettings.cpp
# Opt level: O1

void __thiscall SWDAnalyzerSettings::SWDAnalyzerSettings(SWDAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *this_00;
  AnalyzerSettingInterfaceChannel *this_01;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SWDAnalyzerSettings_00111d60;
  Channel::Channel(&this->mSWDIO,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mSWCLK,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this_00 = &this->mSWDIOInterface;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  this_01 = &this->mSWCLKInterface;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_01);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_00,"SWDIO");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_00);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01,"SWCLK");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_01);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddExportOption((uint)this,(char *)0x0);
  AnalyzerSettings::AddExportExtension((uint)this,(char *)0x0,"text");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSWDIO,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSWCLK,true);
  return;
}

Assistant:

SWDAnalyzerSettings::SWDAnalyzerSettings() : mSWDIO( UNDEFINED_CHANNEL ), mSWCLK( UNDEFINED_CHANNEL )
{
    // init the interface
    mSWDIOInterface.SetTitleAndTooltip( "SWDIO", "SWDIO" );
    mSWDIOInterface.SetChannel( mSWDIO );

    mSWCLKInterface.SetTitleAndTooltip( "SWCLK", "SWCLK" );
    mSWCLKInterface.SetChannel( mSWCLK );

    // add the interface
    AddInterface( &mSWDIOInterface );
    AddInterface( &mSWCLKInterface );

    // describe export
    AddExportOption( 0, "Export as text file" );
    AddExportExtension( 0, "text", "txt" );

    ClearChannels();

    AddChannel( mSWDIO, "SWDIO", false );
    AddChannel( mSWCLK, "SWCLK", false );
}